

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int uv__close_nocancel(int fd)

{
  long lVar1;
  int fd_local;
  
  lVar1 = syscall(3,(ulong)(uint)fd);
  return (int)lVar1;
}

Assistant:

int uv__close_nocancel(int fd) {
#if defined(__APPLE__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wdollar-in-identifier-extension"
#if defined(__LP64__) || TARGET_OS_IPHONE
  extern int close$NOCANCEL(int);
  return close$NOCANCEL(fd);
#else
  extern int close$NOCANCEL$UNIX2003(int);
  return close$NOCANCEL$UNIX2003(fd);
#endif
#pragma GCC diagnostic pop
#elif defined(__linux__) && defined(__SANITIZE_THREAD__) && defined(__clang__)
  long rc;
  __sanitizer_syscall_pre_close(fd);
  rc = syscall(SYS_close, fd);
  __sanitizer_syscall_post_close(rc, fd);
  return rc;
#elif defined(__linux__) && !defined(__SANITIZE_THREAD__)
  return syscall(SYS_close, fd);
#else
  return close(fd);
#endif
}